

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

void __thiscall xLearn::Solver::start_prediction_work(Solver *this)

{
  pointer pfVar1;
  ostream *poVar2;
  Modifier reset;
  Modifier bold;
  Modifier green;
  undefined1 auStack_84 [12];
  pointer pfStack_80;
  pointer local_78;
  Predictor pdc;
  
  pdc.reader_ = (Reader *)&pdc.loss_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pdc,"Start to predict ...","");
  green.code = 0x20;
  bold.code = BOLD;
  reset.code = RESET;
  poVar2 = Color::operator<<((ostream *)&std::cout,&green);
  poVar2 = Color::operator<<(poVar2,&bold);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[ ACTION     ] ",0xf);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)pdc.reader_,(long)pdc.model_);
  poVar2 = Color::operator<<(poVar2,&reset);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (pdc.reader_ != (Reader *)&pdc.loss_) {
    operator_delete(pdc.reader_);
  }
  pdc.out_file_._M_dataplus._M_p = (pointer)&pdc.out_file_.field_2;
  pdc.out_file_._M_string_length = 0;
  pdc.out_file_.field_2._M_local_buf[0] = '\0';
  pdc.out_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  pdc.out_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pdc.out_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Predictor::Initialize
            (&pdc,*(this->reader_).
                   super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                   super__Vector_impl_data._M_start,this->model_,this->loss_,
             &(this->hyper_param_).output_file,(this->hyper_param_).sign,
             (this->hyper_param_).sigmoid,(this->hyper_param_).res_out);
  Predictor::Predict(&pdc);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&green,&pdc.out_);
  (this->out_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_78;
  pfVar1 = (this->out_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->out_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = _green;
  (this->out_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = pfStack_80;
  _green = ZEXT816(0) << 0x20;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  if (_green != (pointer)0x0) {
    operator_delete(_green);
  }
  Predictor::~Predictor(&pdc);
  return;
}

Assistant:

void Solver::start_prediction_work() {
  Color::print_action("Start to predict ...");
  Predictor pdc;
  pdc.Initialize(reader_[0],
                 model_,
                 loss_,
                 hyper_param_.output_file,
                 hyper_param_.sign,
                 hyper_param_.sigmoid,
                 hyper_param_.res_out);
  // Predict and write output
  pdc.Predict();
  this->out_ = pdc.GetResult();
}